

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-logging.cc
# Opt level: O0

Result __thiscall
wabt::BinaryReaderLogging::OnImportTable
          (BinaryReaderLogging *this,Index import_index,string_view module_name,
          string_view field_name,Index table_index,Type elem_type,Limits *elem_limits)

{
  Stream *this_00;
  Enum EVar1;
  char *pcVar2;
  char local_b8 [8];
  char buf [100];
  Index import_index_local;
  BinaryReaderLogging *this_local;
  char *pcStack_38;
  Type elem_type_local;
  string_view field_name_local;
  string_view module_name_local;
  
  pcStack_38 = field_name.data_;
  this_local._4_4_ = elem_type.enum_;
  anon_unknown_22::SPrintLimits(local_b8,100,elem_limits);
  WriteIndent(this);
  this_00 = this->stream_;
  pcVar2 = Type::GetName((Type *)((long)&this_local + 4));
  Stream::Writef(this_00,"OnImportTable(import_index: %u, table_index: %u, elem_type: %s, %s)\n",
                 (ulong)import_index,(ulong)table_index,pcVar2,local_b8);
  EVar1 = (*this->reader_->_vptr_BinaryReaderDelegate[0x13])
                    (this->reader_,(ulong)import_index,module_name.data_,module_name.size_,
                     pcStack_38,field_name.size_,table_index,this_local._4_4_,elem_limits);
  return (Result)EVar1;
}

Assistant:

Result BinaryReaderLogging::OnImportTable(Index import_index,
                                          string_view module_name,
                                          string_view field_name,
                                          Index table_index,
                                          Type elem_type,
                                          const Limits* elem_limits) {
  char buf[100];
  SPrintLimits(buf, sizeof(buf), elem_limits);
  LOGF("OnImportTable(import_index: %" PRIindex ", table_index: %" PRIindex
       ", elem_type: %s, %s)\n",
       import_index, table_index, elem_type.GetName(), buf);
  return reader_->OnImportTable(import_index, module_name, field_name,
                                table_index, elem_type, elem_limits);
}